

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O1

double __thiscall VVCStreamReader::getStreamFPS(VVCStreamReader *this,void *curNalUnit)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (this->m_vps != (VvcVpsUnit *)0x0) {
    dVar1 = VvcVpsUnit::getFPS(this->m_vps);
  }
  if (((dVar1 == 0.0) && (!NAN(dVar1))) && (this->m_sps != (VvcSpsUnit *)0x0)) {
    dVar1 = VvcSpsUnit::getFPS(this->m_sps);
    return dVar1;
  }
  return dVar1;
}

Assistant:

double VVCStreamReader::getStreamFPS(void* curNalUnit)
{
    double fps = 0;
    if (m_vps)
        fps = m_vps->getFPS();
    if (fps == 0.0 && m_sps)
        fps = m_sps->getFPS();
    return fps;
}